

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O2

upb_DefPool * upb_DefPool_New(void)

{
  _Bool _Var1;
  upb_DefPool *s;
  upb_Arena *puVar2;
  void *pvVar3;
  upb_ExtensionRegistry *puVar4;
  upb_Status status;
  
  s = (upb_DefPool *)(*upb_alloc_global.func)(&upb_alloc_global,(void *)0x0,0,0x80);
  if (s != (upb_DefPool *)0x0) {
    puVar2 = upb_Arena_New();
    s->arena = puVar2;
    s->bytes_loaded = 0;
    s->scratch_size = 0xf0;
    pvVar3 = (*upb_alloc_global.func)(&upb_alloc_global,(void *)0x0,0,0xf0);
    s->scratch_data = pvVar3;
    if ((((pvVar3 != (void *)0x0) && (_Var1 = upb_strtable_init(&s->syms,0x20,s->arena), _Var1)) &&
        (_Var1 = upb_strtable_init(&s->files,4,s->arena), _Var1)) &&
       (_Var1 = upb_inttable_init(&s->exts,s->arena), _Var1)) {
      puVar4 = upb_ExtensionRegistry_New(s->arena);
      s->extreg = puVar4;
      if (puVar4 != (upb_ExtensionRegistry *)0x0) {
        s->platform = kUpb_MiniTablePlatform_64Bit;
        _Var1 = upb_DefPool_SetFeatureSetDefaults(s,serialized_defaults,0x51,&status);
        if ((_Var1) && (s->feature_set_defaults != (google_protobuf_FeatureSetDefaults *)0x0)) {
          return s;
        }
      }
    }
    upb_DefPool_Free(s);
  }
  return (upb_DefPool *)0x0;
}

Assistant:

upb_DefPool* upb_DefPool_New(void) {
  upb_DefPool* s = upb_gmalloc(sizeof(*s));
  if (!s) return NULL;

  s->arena = upb_Arena_New();
  s->bytes_loaded = 0;

  s->scratch_size = 240;
  s->scratch_data = upb_gmalloc(s->scratch_size);
  if (!s->scratch_data) goto err;

  if (!upb_strtable_init(&s->syms, 32, s->arena)) goto err;
  if (!upb_strtable_init(&s->files, 4, s->arena)) goto err;
  if (!upb_inttable_init(&s->exts, s->arena)) goto err;

  s->extreg = upb_ExtensionRegistry_New(s->arena);
  if (!s->extreg) goto err;

  s->platform = kUpb_MiniTablePlatform_Native;

  upb_Status status;
  if (!upb_DefPool_SetFeatureSetDefaults(
          s, serialized_defaults, sizeof(serialized_defaults) - 1, &status)) {
    goto err;
  }

  if (!s->feature_set_defaults) goto err;

  return s;

err:
  upb_DefPool_Free(s);
  return NULL;
}